

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

bool __thiscall wabt::WastLexer::ReadLineComment(WastLexer *this)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar1 = this->buffer_end_;
  pcVar3 = this->cursor_;
  do {
    pcVar2 = pcVar3;
    if (pcVar1 <= pcVar2) goto LAB_00152467;
    pcVar3 = pcVar2 + 1;
    this->cursor_ = pcVar3;
    if (*pcVar2 == '\n') goto LAB_00152460;
  } while (*pcVar2 != '\r');
  if ((pcVar3 < pcVar1) && (*pcVar3 == '\n')) {
    pcVar3 = pcVar2 + 2;
    this->cursor_ = pcVar3;
  }
LAB_00152460:
  this->line_ = this->line_ + 1;
  this->line_start_ = pcVar3;
LAB_00152467:
  return pcVar2 < pcVar1;
}

Assistant:

bool WastLexer::ReadLineComment() {
  while (true) {
    switch (ReadChar()) {
      case kEof:
        return false;

      case '\r':
        if (PeekChar() == '\n') {
          ReadChar();
        }
        Newline();
        return true;

      case '\n':
        Newline();
        return true;
    }
  }
}